

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.h
# Opt level: O2

void __thiscall
YacclabTests::CheckAlgorithms<void(Labeling::*)(int,int,int),int,int,int>
          (YacclabTests *this,string *title,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ccl_algorithms,offset_in_Labeling_to_subr func,int *args,int *args_1,int *args_2)

{
  pointer pbVar1;
  GlobalConfig *pGVar2;
  string *psVar3;
  size_type sVar4;
  pointer pbVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  Labeling *pLVar10;
  size_t n_things_todo;
  Labeling *pLVar11;
  undefined4 extraout_var;
  long *plVar12;
  code *pcVar13;
  undefined4 extraout_var_01;
  uint uVar14;
  string *s;
  uint progress;
  pointer __rhs;
  String *lhs;
  ulong uVar15;
  bool bVar16;
  reference rVar17;
  _Bit_iterator _Var18;
  undefined4 *in_stack_00000010;
  uint local_2e4;
  pointer local_2c0;
  long *local_2b8;
  string dataset_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  path dataset_path;
  out_of_range anon_var_0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  filenames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string filename;
  vector<bool,_std::allocator<bool>_> stats;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  first_fail;
  string correct_algo_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  path local_120;
  path local_100;
  OutputBox ob;
  undefined4 extraout_var_00;
  
  OutputBox::OutputBox(&ob,title,0x50,2);
  correct_algo_name._M_dataplus._M_p._0_1_ = 1;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&stats,(long)(ccl_algorithms->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(ccl_algorithms->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5,(bool *)&correct_algo_name
             ,(allocator_type *)&dataset_name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&first_fail,
           (long)(ccl_algorithms->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(ccl_algorithms->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5,
           (allocator_type *)&correct_algo_name);
  correct_algo_name._M_dataplus._M_p = (pointer)&correct_algo_name.field_2;
  correct_algo_name._M_string_length = 0;
  correct_algo_name.field_2._M_local_buf[0] = '\0';
  pLVar10 = LabelingMapSingleton::GetLabeling
                      ((ccl_algorithms->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
  (*pLVar10->_vptr_Labeling[7])(&dataset_name,pLVar10);
  std::__cxx11::string::operator=((string *)&correct_algo_name,(string *)&dataset_name);
  std::__cxx11::string::~string((string *)&dataset_name);
  pLVar10 = LabelingMapSingleton::GetLabeling(&correct_algo_name);
  uVar14 = 0;
  bVar16 = false;
  do {
    pbVar1 = (this->mode_cfg_->check_datasets).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->mode_cfg_->check_datasets).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <=
        (ulong)uVar14) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&messages,
               (ulong)((long)(ccl_algorithms->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(ccl_algorithms->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start) >> 5 & 0xffffffff,
               (allocator_type *)&dataset_name);
      __rhs = (ccl_algorithms->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (ccl_algorithms->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pbVar5 = __rhs;
      lhs = __rhs;
      local_2c0 = __rhs;
      if (__rhs != pbVar1) {
        while (lhs = pbVar5, __rhs = __rhs + 1, __rhs != pbVar1) {
          bVar16 = CompareLengthCvString(lhs,__rhs);
          pbVar5 = __rhs;
          if (!bVar16) {
            pbVar5 = lhs;
          }
        }
        __rhs = (ccl_algorithms->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
        local_2c0 = (ccl_algorithms->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
      }
      sVar4 = lhs->_M_string_length;
      local_2e4 = 0;
      while( true ) {
        if (__rhs == local_2c0) break;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &anon_var_0,"\'",__rhs);
        std::operator+(&dataset_path.path_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &anon_var_0,"\'");
        filename._M_dataplus._M_p = (pointer)&filename.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&filename,(char)(int)sVar4 - (char)__rhs->_M_string_length);
        std::operator+(&dataset_name,&dataset_path.path_,&filename);
        uVar15 = (ulong)local_2e4;
        std::__cxx11::string::operator=
                  ((string *)
                   (messages.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar15),(string *)&dataset_name);
        std::__cxx11::string::~string((string *)&dataset_name);
        std::__cxx11::string::~string((string *)&filename);
        std::__cxx11::string::~string((string *)&dataset_path.path_);
        std::__cxx11::string::~string((string *)&anon_var_0);
        rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](&stats,uVar15);
        if ((*rVar17._M_p & rVar17._M_mask) == 0) {
          std::operator+(&dataset_path.path_,"-> NOT correct, it first fails on \'",
                         first_fail.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar15);
          std::operator+(&dataset_name,&dataset_path.path_,"\'");
          std::__cxx11::string::append
                    ((string *)
                     (messages.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar15));
          std::__cxx11::string::~string((string *)&dataset_name);
          std::__cxx11::string::~string((string *)&dataset_path.path_);
        }
        else {
          std::__cxx11::string::append
                    ((char *)(messages.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar15));
        }
        local_2e4 = local_2e4 + 1;
        __rhs = __rhs + 1;
      }
      std::__cxx11::string::string((string *)&dataset_name,"Report",(allocator *)&dataset_path);
      OutputBox::DisplayReport(&ob,&dataset_name,&messages);
      std::__cxx11::string::~string((string *)&dataset_name);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&messages);
      std::__cxx11::string::~string((string *)&correct_algo_name);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&first_fail);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&stats.super__Bvector_base<std::allocator<bool>_>);
      OutputBox::~OutputBox(&ob);
      return;
    }
    std::__cxx11::string::string((string *)&dataset_name,(string *)(pbVar1 + uVar14));
    pGVar2 = this->glob_cfg_;
    filesystem::path::path((path *)&anon_var_0,&dataset_name);
    filesystem::operator/(&dataset_path,&pGVar2->input_path,(path *)&anon_var_0);
    std::__cxx11::string::~string((string *)&anon_var_0);
    filesystem::path::path((path *)&filename,&this->glob_cfg_->input_txt);
    filesystem::operator/((path *)&anon_var_0,&dataset_path,(path *)&filename);
    std::__cxx11::string::~string((string *)&filename);
    filenames.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    filenames.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    filenames.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar6 = LoadFileList(this,&filenames,(path *)&anon_var_0);
    if (bVar6) {
      n_things_todo =
           ((long)filenames.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)filenames.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x28;
      OutputBox::StartUnitaryBox(&ob,&dataset_name,n_things_todo);
      progress = 0;
      while( true ) {
        if ((n_things_todo <= progress) || (bVar16)) break;
        ProgressBar::Display(&ob.pb,progress);
        std::__cxx11::string::string
                  ((string *)&filename,
                   (string *)
                   (filenames.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + progress));
        filesystem::path::path((path *)&local_208,&filename);
        filesystem::operator/((path *)&messages,&dataset_path,(path *)&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        pLVar11 = LabelingMapSingleton::GetLabeling
                            ((ccl_algorithms->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
        iVar8 = (*pLVar11->_vptr_Labeling[9])(pLVar11);
        std::__cxx11::string::string((string *)&local_208,(string *)&messages);
        cVar7 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar8) + 0x20))
                          ((long *)CONCAT44(extraout_var,iVar8),&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        if (cVar7 == '\0') {
          std::operator+(&local_140,"Unable to open \'",&filename);
          std::operator+(&local_208,&local_140,"\'");
          OutputBox::Cmessage(&ob,&local_208);
          std::__cxx11::string::~string((string *)&local_208);
          std::__cxx11::string::~string((string *)&local_140);
          bVar16 = false;
        }
        else {
          (*pLVar10->_vptr_Labeling[2])();
          iVar8 = (*pLVar10->_vptr_Labeling[10])();
          plVar12 = (long *)CONCAT44(extraout_var_00,iVar8);
          (**(code **)(*plVar12 + 0x28))(plVar12);
          (**(code **)(*plVar12 + 0x40))(&local_2b8,plVar12);
          (*pLVar10->_vptr_Labeling[5])();
          plVar12 = local_2b8;
          uVar9 = (*pLVar10->_vptr_Labeling[8])();
          (**(code **)(*plVar12 + 0x18))(plVar12,uVar9 & 0xff);
          s = (ccl_algorithms->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
          psVar3 = (ccl_algorithms->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          local_2e4 = 0;
          for (; bVar16 = s != psVar3, bVar16; s = s + 1) {
            pLVar11 = LabelingMapSingleton::GetLabeling(s);
            uVar15 = (ulong)local_2e4;
            rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](&stats,uVar15);
            if ((*rVar17._M_p & rVar17._M_mask) != 0) {
              plVar12 = (long *)((long)&pLVar11->_vptr_Labeling + (long)args);
              pcVar13 = (code *)func;
              if ((func & 1) != 0) {
                pcVar13 = *(code **)(*plVar12 + -1 + func);
              }
              (*pcVar13)(plVar12,*args_1,*args_2,*in_stack_00000010);
              iVar8 = (*pLVar11->_vptr_Labeling[10])(pLVar11);
              plVar12 = (long *)CONCAT44(extraout_var_01,iVar8);
              (**(code **)(*plVar12 + 0x28))(plVar12);
              uVar9 = (*pLVar11->_vptr_Labeling[8])(pLVar11);
              (**(code **)(*plVar12 + 0x18))(plVar12,uVar9 & 0xff);
              cVar7 = (**(code **)(*local_2b8 + 0x38))(local_2b8,plVar12);
              (*pLVar11->_vptr_Labeling[5])(pLVar11);
              if (cVar7 == '\0') {
                rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](&stats,uVar15);
                *rVar17._M_p = *rVar17._M_p & ~rVar17._M_mask;
                filesystem::path::path(&local_120,&dataset_name);
                filesystem::path::path(&local_100,&filename);
                filesystem::operator/((path *)&local_140,&local_120,&local_100);
                std::__cxx11::string::string((string *)&local_208,(string *)&local_140);
                std::__cxx11::string::operator=
                          ((string *)
                           (first_fail.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar15),(string *)&local_208
                          );
                std::__cxx11::string::~string((string *)&local_208);
                std::__cxx11::string::~string((string *)&local_140);
                std::__cxx11::string::~string((string *)&local_100);
                std::__cxx11::string::~string((string *)&local_120);
                _Var18 = std::
                         __adjacent_find<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_comp_iter<std::not_equal_to<int>>>
                                   (stats.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                                    0,stats.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                      _M_p,stats.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                           super__Bvector_impl_data._M_finish.
                                           super__Bit_iterator_base._M_offset);
                if ((_Var18.super__Bit_iterator_base._M_p ==
                     stats.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
                   (_Var18.super__Bit_iterator_base._M_offset ==
                    stats.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset)) break;
              }
            }
            local_2e4 = local_2e4 + 1;
          }
          if (local_2b8 != (long *)0x0) {
            (**(code **)(*local_2b8 + 0x10))();
          }
        }
        std::__cxx11::string::~string((string *)&messages);
        std::__cxx11::string::~string((string *)&filename);
        progress = progress + 1;
      }
      OutputBox::StopUnitaryBox(&ob);
    }
    else {
      std::__cxx11::string::string((string *)&local_208,(string *)&anon_var_0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&messages,
                     "Unable to open \'",&local_208);
      std::operator+(&filename,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&messages,
                     "\'");
      OutputBox::Cwarning(&ob,&filename,&dataset_name);
      std::__cxx11::string::~string((string *)&filename);
      std::__cxx11::string::~string((string *)&messages);
      std::__cxx11::string::~string((string *)&local_208);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::~vector(&filenames);
    std::__cxx11::string::~string((string *)&anon_var_0);
    std::__cxx11::string::~string((string *)&dataset_path);
    std::__cxx11::string::~string((string *)&dataset_name);
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

void CheckAlgorithms(const std::string& title, const std::vector<std::string>& ccl_algorithms, const FnP func, Args&&... args) {

		OutputBox ob(title);

		std::vector<bool> stats(ccl_algorithms.size(), true);  // True if the i-th algorithm is correct, false otherwise
		std::vector<std::string> first_fail(ccl_algorithms.size());  // Name of the file on which algorithm fails the first time
		bool stop = false; // True if all the algorithms are not correct

		std::string correct_algo_name;
		try {
			correct_algo_name = LabelingMapSingleton::GetLabeling(ccl_algorithms[0])->CheckAlg();
		}
		catch (std::out_of_range) {
			ob.Cwarning("No correct algorithm is available, correctness test skipped.");
			return;
		}
		Labeling* correct_algo = LabelingMapSingleton::GetLabeling(correct_algo_name);

		for (unsigned i = 0; i < mode_cfg_.check_datasets.size(); ++i) { // For every dataset in the check_datasets list
			std::string dataset_name(mode_cfg_.check_datasets[i]);
			path dataset_path(glob_cfg_.input_path / path(dataset_name));
			path is_path = dataset_path / path(glob_cfg_.input_txt); // files.txt path

			// Load list of images on which ccl_algorithms must be tested
			std::vector<std::pair<std::string, bool>> filenames; // first: filename, second: state of filename (find or not)
			if (!LoadFileList(filenames, is_path)) {
				ob.Cwarning("Unable to open '" + is_path.string() + "'", dataset_name);
				continue;
			}

			// Number of files
			size_t filenames_size = filenames.size();
			ob.StartUnitaryBox(dataset_name, filenames_size);

			for (unsigned file = 0; file < filenames_size && !stop; ++file) { // For each file in list
				ob.UpdateUnitaryBox(file);

				std::string filename = filenames[file].first;
				path filename_path = dataset_path / path(filename);

				// Load image
				if (!LabelingMapSingleton::GetLabeling(ccl_algorithms[0])->GetInput()->ReadBinary(filename_path.string())) {
					ob.Cmessage("Unable to open '" + filename + "'");
					continue;
				}

				// These variables aren't necessary
				// unsigned n_labels_correct, n_labels_to_control;
				
				correct_algo->PerformLabeling();
				//n_labels_correct = sauf->n_labels_;
                YacclabTensorOutput* correct_algo_out = correct_algo->GetOutput();
                correct_algo_out->PrepareForCheck();

                std::unique_ptr<YacclabTensorOutput> labels_correct = correct_algo_out->Copy();

                correct_algo->FreeLabelingData();

                labels_correct->NormalizeLabels(correct_algo->IsLabelBackground());

				unsigned j = 0;
				for (const auto& algo_name : ccl_algorithms) {
					Labeling *algorithm = LabelingMapSingleton::GetLabeling(algo_name);

					// Perform labeling on current algorithm if it has no previously failed
					if (stats[j]) {
						(algorithm->*func)(std::forward<Args>(args)...);
                        YacclabTensorOutput* labels_to_check = algorithm->GetOutput();
                        labels_to_check->PrepareForCheck();
                        labels_to_check->NormalizeLabels(algorithm->IsLabelBackground());
                        const bool correct = labels_correct->Equals(labels_to_check);
                        // const bool diff = algorithm->Check(correct_algo);
						algorithm->FreeLabelingData();
						if (!correct) {
							stats[j] = false;
							first_fail[j] = (path(dataset_name) / path(filename)).string();

							// Stop check test if all the algorithms fail
							if (adjacent_find(stats.begin(), stats.end(), std::not_equal_to<int>()) == stats.end()) {
								stop = true;
								break;
							}
						}
					}
					++j;
				} // For all the Algorithms in the array
                //correct_algo->FreeLabelingData();

			}// END WHILE (LIST OF IMAGES)
			ob.StopUnitaryBox();
		}// END FOR (LIST OF DATASETS)

		// LabelingMapSingleton::GetLabeling(ccl_algorithms[0])->ReleaseInput();

		 // To display report of correctness test
		std::vector<std::string> messages(static_cast<unsigned int>(ccl_algorithms.size()));
		unsigned longest_name = static_cast<unsigned>(max_element(ccl_algorithms.begin(), ccl_algorithms.end(), CompareLengthCvString)->length());

		unsigned j = 0;
		for (const auto& algo_name : ccl_algorithms) {
			messages[j] = "'" + algo_name + "'" + std::string(longest_name - algo_name.size(), '-');
			if (stats[j]) {
				messages[j] += "-> correct!";
			}
			else {
				messages[j] += "-> NOT correct, it first fails on '" + first_fail[j] + "'";
			}
			++j;
		}
		ob.DisplayReport("Report", messages);
	}